

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O1

void al_set_display_icons(ALLEGRO_DISPLAY *display,int num_icons,ALLEGRO_BITMAP **icons)

{
  _func_void_ALLEGRO_DISPLAY_ptr_int_ALLEGRO_BITMAP_ptr_ptr *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = display->vt->set_icons;
  if (UNRECOVERED_JUMPTABLE != (_func_void_ALLEGRO_DISPLAY_ptr_int_ALLEGRO_BITMAP_ptr_ptr *)0x0) {
    (*UNRECOVERED_JUMPTABLE)(display,num_icons,icons);
    return;
  }
  return;
}

Assistant:

void al_set_display_icons(ALLEGRO_DISPLAY *display,
   int num_icons, ALLEGRO_BITMAP *icons[])
{
   int i;

   ASSERT(display);
   ASSERT(num_icons >= 1);
   ASSERT(icons);
   for (i = 0; i < num_icons; i++) {
      ASSERT(icons[i]);
   }

   if (display->vt->set_icons) {
      display->vt->set_icons(display, num_icons, icons);
   }
}